

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

bool __thiscall AI::canrev(AI *this,int i,int j,int who)

{
  pair<int,_int> *ppVar1;
  pair<int,_int> *ppVar2;
  int iVar3;
  pair<int,_int> *ppVar4;
  bool bVar5;
  
  if (i < 0) {
    return false;
  }
  if (((-1 < j && (ulong)(uint)i < this->boardSize) && ((ulong)(uint)j < this->boardSize)) &&
     (*(int *)(*(long *)&(this->board->
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start[(uint)i].
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data + (ulong)(uint)j * 4) == 0)) {
    ppVar1 = (this->directions).
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    ppVar2 = (this->directions).
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (ppVar1 != ppVar2) {
      do {
        ppVar4 = ppVar1 + 1;
        iVar3 = reverseDirection(this,i,j,who,*ppVar1,false);
        bVar5 = iVar3 != 0;
        if (bVar5) {
          return bVar5;
        }
        ppVar1 = ppVar4;
      } while (ppVar4 != ppVar2);
      return bVar5;
    }
  }
  return false;
}

Assistant:

bool AI::canrev(int i, int j, int who) {
    if (i < 0 || i >= boardSize || j < 0 || j >= boardSize) return false;
    if (board[i][j] != EMPTY) return false;
    for (auto &dir: directions) {
        int num = reverseDirection(i, j, who, dir);
        if (num) return true;
    }
    return false;
}